

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_worker_ctor_internal
                  (JSContext *ctx,JSValue new_target,JSWorkerMessagePipe *recv_pipe,
                  JSWorkerMessagePipe *send_pipe)

{
  JSValue v;
  JSValue v_00;
  JSValue proto_val;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  undefined8 *opaque;
  JSWorkerMessagePipe *pJVar3;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValue JVar4;
  JSWorkerData *s;
  JSValue proto;
  JSValue obj;
  JSClassID in_stack_ffffffffffffff6c;
  JSValueUnion in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  JSClassID in_stack_ffffffffffffff7c;
  JSValueUnion in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  undefined4 local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar4.tag = in_RDX;
  JVar4.u.float64 = in_RSI.float64;
  iVar2 = JS_IsUndefined(JVar4);
  if (iVar2 == 0) {
    this_obj.tag = in_stack_ffffffffffffff98;
    this_obj.u.ptr = in_stack_ffffffffffffff90.ptr;
    JVar4 = JS_GetPropertyStr((JSContext *)in_stack_ffffffffffffff88.ptr,this_obj,
                              (char *)in_stack_ffffffffffffff80.ptr);
    in_stack_ffffffffffffff80 = JVar4.u;
    in_stack_ffffffffffffff88 = (JSValueUnion)JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) goto LAB_00112fd9;
  }
  else {
    JVar4 = JS_GetClassProto((JSContext *)in_stack_ffffffffffffff70.ptr,in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff90 = JVar4.u;
LAB_00112fd9:
    proto_val.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
    proto_val.u.ptr = in_stack_ffffffffffffff88.ptr;
    JVar4 = JS_NewObjectProtoClass
                      ((JSContext *)in_stack_ffffffffffffff80.ptr,proto_val,
                       in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffff70 = JVar4.u;
    in_stack_ffffffffffffff78 = (undefined4)JVar4.tag;
    in_stack_ffffffffffffff7c = JVar4.tag._4_4_;
    local_8 = (JSValueUnion)JVar4.tag;
    v.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
    v.u.ptr = local_8.ptr;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v);
    iVar2 = JS_IsException(JVar4);
    if ((iVar2 == 0) &&
       (opaque = (undefined8 *)
                 js_mallocz((JSContext *)in_stack_ffffffffffffff88.ptr,
                            (size_t)in_stack_ffffffffffffff80), opaque != (undefined8 *)0x0)) {
      pJVar3 = js_dup_message_pipe((JSWorkerMessagePipe *)0x113063);
      *opaque = pJVar3;
      pJVar3 = js_dup_message_pipe((JSWorkerMessagePipe *)0x113078);
      opaque[1] = pJVar3;
      JS_SetOpaque(JVar4,opaque);
      local_10 = JVar4.u._0_4_;
      uStack_c = JVar4.u._4_4_;
      goto LAB_001130df;
    }
  }
  v_00.u._4_4_ = in_stack_ffffffffffffff7c;
  v_00.u.int32 = in_stack_ffffffffffffff78;
  v_00.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v_00);
  local_10 = 0;
  local_8.float64 = 2.96439387504748e-323;
LAB_001130df:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_worker_ctor_internal(JSContext *ctx, JSValueConst new_target,
                                       JSWorkerMessagePipe *recv_pipe,
                                       JSWorkerMessagePipe *send_pipe)
{
    JSValue obj = JS_UNDEFINED, proto;
    JSWorkerData *s;
    
    /* create the object */
    if (JS_IsUndefined(new_target)) {
        proto = JS_GetClassProto(ctx, js_worker_class_id);
    } else {
        proto = JS_GetPropertyStr(ctx, new_target, "prototype");
        if (JS_IsException(proto))
            goto fail;
    }
    obj = JS_NewObjectProtoClass(ctx, proto, js_worker_class_id);
    JS_FreeValue(ctx, proto);
    if (JS_IsException(obj))
        goto fail;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    s->recv_pipe = js_dup_message_pipe(recv_pipe);
    s->send_pipe = js_dup_message_pipe(send_pipe);

    JS_SetOpaque(obj, s);
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}